

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_from_file
                    (nk_font_atlas *atlas,char *file_path,float height,nk_font_config *config)

{
  FILE *__stream;
  size_t __n;
  void *__ptr;
  nk_font *pnVar1;
  long lVar2;
  void *pvVar3;
  nk_font_config *pnVar4;
  size_t unaff_R15;
  byte bVar5;
  nk_font_config cfg;
  nk_font_config local_88;
  
  bVar5 = 0;
  if (file_path == (char *)0x0 || atlas == (nk_font_atlas *)0x0) {
    return (nk_font *)0x0;
  }
  __stream = fopen(file_path,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    pvVar3 = (void *)0x0;
    if (-1 < (long)__n) {
      fseek(__stream,0,0);
      __ptr = (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,__n);
      pvVar3 = (void *)0x0;
      unaff_R15 = __n;
      if (__ptr != (void *)0x0) {
        unaff_R15 = fread(__ptr,1,__n,__stream);
        pvVar3 = __ptr;
      }
    }
    fclose(__stream);
    if (pvVar3 != (void *)0x0) {
      if (config == (nk_font_config *)0x0) {
        nk_font_config(&local_88,height);
      }
      else {
        pnVar4 = &local_88;
        for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
          pnVar4->next = config->next;
          config = (nk_font_config *)((long)config + (ulong)bVar5 * -0x10 + 8);
          pnVar4 = (nk_font_config *)((long)pnVar4 + ((ulong)bVar5 * -2 + 1) * 8);
        }
      }
      local_88.ttf_data_owned_by_atlas = '\x01';
      local_88.ttf_blob = pvVar3;
      local_88.ttf_size = unaff_R15;
      local_88.size = height;
      pnVar1 = nk_font_atlas_add(atlas,&local_88);
      return pnVar1;
    }
  }
  return (nk_font *)0x0;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_file(struct nk_font_atlas *atlas, const char *file_path,
float height, const struct nk_font_config *config)
{
nk_size size;
char *memory;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

if (!atlas || !file_path) return 0;
memory = nk_file_load(file_path, &size, &atlas->permanent);
if (!memory) return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}